

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::add_sample
          (TypedTimeSamples<std::array<float,_2UL>_> *this,double t,array<float,_2UL> *v)

{
  undefined1 local_38 [8];
  Sample s;
  array<float,_2UL> *v_local;
  double t_local;
  TypedTimeSamples<std::array<float,_2UL>_> *this_local;
  
  s._16_8_ = v;
  Sample::Sample((Sample *)local_38);
  s.t = *(double *)s._16_8_;
  local_38 = (undefined1  [8])t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
              *)this,(Sample *)local_38);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }